

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

void __thiscall DElevator::DElevator(DElevator *this,sector_t_conflict *sec)

{
  DInterpolation *pDVar1;
  sector_t_conflict *sec_local;
  DElevator *this_local;
  
  DMover::DMover(&this->super_DMover,sec);
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_009f75e0;
  TObjPtr<DInterpolation>::TObjPtr(&this->m_Interp_Ceiling);
  TObjPtr<DInterpolation>::TObjPtr(&this->m_Interp_Floor);
  TObjPtr<DSectorEffect>::operator=(&sec->floordata,(DSectorEffect *)this);
  TObjPtr<DSectorEffect>::operator=(&sec->ceilingdata,(DSectorEffect *)this);
  pDVar1 = sector_t::SetInterpolation((sector_t *)sec,1,true);
  TObjPtr<DInterpolation>::operator=(&this->m_Interp_Floor,pDVar1);
  pDVar1 = sector_t::SetInterpolation((sector_t *)sec,0,true);
  TObjPtr<DInterpolation>::operator=(&this->m_Interp_Ceiling,pDVar1);
  return;
}

Assistant:

DElevator::DElevator (sector_t *sec)
	: Super (sec)
{
	sec->floordata = this;
	sec->ceilingdata = this;
	m_Interp_Floor = sec->SetInterpolation(sector_t::FloorMove, true);
	m_Interp_Ceiling = sec->SetInterpolation(sector_t::CeilingMove, true);
}